

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int CloseSDL2AudioDevice(void)

{
  bool bVar1;
  SDL_bool close_sdl2_device;
  
  (*SDL20_LockAudio)();
  bVar1 = false;
  if ((audio_cbdata != (AudioCallbackWrapperData *)0x0) &&
     (bVar1 = false, audio_cbdata->app_callback_opened == SDL_FALSE)) {
    bVar1 = audio_cbdata->cdrom_opened == SDL_FALSE;
  }
  (*SDL20_UnlockAudio)();
  if (bVar1) {
    (*SDL20_CloseAudio)();
    (*SDL20_FreeAudioStream)(audio_cbdata->app_callback_stream);
    (*SDL20_FreeAudioStream)(audio_cbdata->cdrom_stream);
    (*SDL20_free)(audio_cbdata->mix_buffer);
    (*SDL20_free)(audio_cbdata);
    audio_cbdata = (AudioCallbackWrapperData *)0x0;
  }
  return -1;
}

Assistant:

static int
CloseSDL2AudioDevice(void)
{
    SDL_bool close_sdl2_device;

    SDL20_LockAudio();
    close_sdl2_device = (audio_cbdata && !audio_cbdata->app_callback_opened && !audio_cbdata->cdrom_opened) ? SDL_TRUE : SDL_FALSE;
    SDL20_UnlockAudio();

    if (close_sdl2_device) {
        SDL20_CloseAudio();
        SDL20_FreeAudioStream(audio_cbdata->app_callback_stream);
        SDL20_FreeAudioStream(audio_cbdata->cdrom_stream);
        SDL20_free(audio_cbdata->mix_buffer);
        SDL20_free(audio_cbdata);
        audio_cbdata = NULL;
    }

    return -1;
}